

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::start_announce(udp_tracker_connection *this)

{
  iterator __position;
  time_point tVar1;
  unique_lock<std::mutex> l;
  key_type local_40;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = (mutex_type *)m_cache_mutex;
  local_20._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if ((this->m_target).impl_.data_.base.sa_family == 2) {
    local_40._0_8_ = (ulong)(this->m_target).impl_.data_.v6.sin6_flowinfo << 0x20;
    local_40.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_40.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_40.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_40.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
    local_40.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
    local_40.ipv6_address_.scope_id_ = (unsigned_long)(this->m_target).impl_.data_.v6.sin6_scope_id;
    local_40.type_ = ipv6;
    local_40.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  __position = ::std::
               _Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
               ::find((_Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                       *)m_connection_cache,&local_40);
  if (__position._M_node != (_Base_ptr)(m_connection_cache + 8)) {
    tVar1 = time_now();
    if ((long)tVar1.__d.__r < (long)__position._M_node[2]._M_parent) {
      if (((this->super_tracker_connection).m_req.kind.m_val & 1) == 0) {
        send_udp_announce(this);
      }
      else {
        send_udp_scrape(this);
      }
      goto LAB_0038a3ab;
    }
    ::std::
    _Rb_tree<boost::asio::ip::address,std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>,std::_Select1st<std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>>,std::less<boost::asio::ip::address>,std::allocator<std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>>>
    ::erase_abi_cxx11_((_Rb_tree<boost::asio::ip::address,std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>,std::_Select1st<std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>>,std::less<boost::asio::ip::address>,std::allocator<std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>>>
                        *)m_connection_cache,__position);
  }
  ::std::unique_lock<std::mutex>::unlock(&local_20);
  send_udp_connect(this);
LAB_0038a3ab:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void udp_tracker_connection::start_announce()
	{
		std::unique_lock<std::mutex> l(m_cache_mutex);
		auto const cc = m_connection_cache.find(m_target.address());
		if (cc != m_connection_cache.end())
		{
			// we found a cached entry! Now, we can only
			// use if if it hasn't expired
			if (aux::time_now() < cc->second.expires)
			{
				if (tracker_req().kind & tracker_request::scrape_request)
					send_udp_scrape();
				else
					send_udp_announce();
				return;
			}
			// if it expired, remove it from the cache
			m_connection_cache.erase(cc);
		}
		l.unlock();

		send_udp_connect();
	}